

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockwise.c
# Opt level: O2

void cf_blockwise_accumulate_final
               (uint8_t *partial,size_t *npartial,size_t nblock,void *inp,size_t nbytes,
               cf_blockwise_in_fn process,cf_blockwise_in_fn process_final,void *ctx)

{
  size_t sVar1;
  cf_blockwise_in_fn p_Var2;
  ulong __n;
  ulong uVar3;
  
  if (partial != (uint8_t *)0x0) {
    uVar3 = *npartial;
    __n = nblock - uVar3;
    if ((((uVar3 <= nblock && __n != 0) && (nbytes == 0 || inp != (void *)0x0)) &&
        (process != (cf_blockwise_in_fn)0x0)) && (ctx != (void *)0x0)) {
      if (uVar3 != 0 && nbytes != 0) {
        if (nbytes <= __n) {
          __n = nbytes;
        }
        memcpy(partial + uVar3,inp,__n);
        inp = (void *)((long)inp + __n);
        nbytes = nbytes - __n;
        sVar1 = *npartial;
        *npartial = __n + sVar1;
        if (__n + sVar1 == nblock) {
          p_Var2 = process;
          if (nbytes == 0) {
            p_Var2 = process_final;
          }
          (*p_Var2)(ctx,partial);
          *npartial = 0;
        }
      }
      while (nblock <= nbytes) {
        if (*npartial != 0) goto LAB_0010b401;
        nbytes = nbytes - nblock;
        p_Var2 = process;
        if (nbytes == 0) {
          p_Var2 = process_final;
        }
        (*p_Var2)(ctx,(uint8_t *)inp);
        inp = (void *)((long)inp + nblock);
      }
      while( true ) {
        if (nbytes == 0) {
          return;
        }
        uVar3 = nblock - *npartial;
        if (nbytes <= uVar3) {
          uVar3 = nbytes;
        }
        memcpy(partial + *npartial,inp,uVar3);
        sVar1 = *npartial;
        *npartial = sVar1 + uVar3;
        if (nblock <= sVar1 + uVar3) break;
        nbytes = nbytes - uVar3;
        inp = (void *)((long)inp + uVar3);
      }
    }
  }
LAB_0010b401:
  abort();
}

Assistant:

void cf_blockwise_accumulate_final(uint8_t *partial, size_t *npartial, size_t nblock,
                                   const void *inp, size_t nbytes,
                                   cf_blockwise_in_fn process,
                                   cf_blockwise_in_fn process_final,
                                   void *ctx)
{
  const uint8_t *bufin = inp;
  assert(partial && *npartial < nblock);
  assert(inp || !nbytes);
  assert(process && ctx);

  /* If we have partial data, copy in to buffer. */
  if (*npartial && nbytes)
  {
    size_t space = nblock - *npartial;
    size_t taken = MIN(space, nbytes);

    memcpy(partial + *npartial, bufin, taken);

    bufin += taken;
    nbytes -= taken;
    *npartial += taken;

    /* If that gives us a full block, process it. */
    if (*npartial == nblock)
    {
      if (nbytes == 0)
        process_final(ctx, partial);
      else
        process(ctx, partial);
      *npartial = 0;
    }
  }

  /* now nbytes < nblock or *npartial == 0. */

  /* If we have a full block of data, process it directly. */
  while (nbytes >= nblock)
  {
    /* Partial buffer must be empty, or we're ignoring extant data */
    assert(*npartial == 0);

    if (nbytes == nblock)
      process_final(ctx, bufin);
    else
      process(ctx, bufin);
    bufin += nblock;
    nbytes -= nblock;
  }

  /* Finally, if we have remaining data, buffer it. */
  while (nbytes)
  {
    size_t space = nblock - *npartial;
    size_t taken = MIN(space, nbytes);

    memcpy(partial + *npartial, bufin, taken);

    bufin += taken;
    nbytes -= taken;
    *npartial += taken;

    /* If we started with *npartial, we must have copied it
     * in first. */
    assert(*npartial < nblock);
  }
}